

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFramebuffer.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderLayeredFramebufferBlending::iterate
          (GeometryShaderLayeredFramebufferBlending *this)

{
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *pTVar7;
  TestLog *this_01;
  MessageBuilder *pMVar8;
  undefined8 in_stack_fffffffffffff9b8;
  undefined4 uVar9;
  Functions **sh2_body_parts;
  undefined4 uVar10;
  uchar *local_528;
  uchar *local_520;
  uchar *local_518;
  uint local_4f4;
  uint local_4f0;
  uint local_4ec;
  uint local_4e8;
  uint local_4e4;
  uint local_4e0;
  uint local_4dc;
  uint local_4d8 [2];
  MessageBuilder local_4d0;
  byte *local_350;
  uchar *ref_data;
  uchar *data;
  uchar *row;
  uchar *ref_row;
  uchar *puStack_328;
  uint pixel_size;
  uchar *ref_buffer;
  float fStack_318;
  bool has_layer_failed;
  float temp_component;
  float slice_rgba [4];
  uchar *slice_ptr;
  uchar *ref_slice_ptr;
  uchar *slice_pixels_ptr_1 [4];
  uchar *ref_slice_pixels_ptr [4];
  uchar *slice_pixels_ptr [4];
  uchar local_288 [8];
  uchar ref_buffer_slice4 [64];
  uchar ref_buffer_slice3 [64];
  uchar ref_buffer_slice2 [64];
  uchar ref_buffer_slice1 [64];
  uchar buffer_slice4 [64];
  uchar buffer_slice3 [64];
  uchar buffer_slice2 [64];
  uchar buffer_slice1 [64];
  uchar buffer [64];
  uint y;
  uint x;
  uint n_slice;
  uint n_layer;
  uint n_component;
  uint n;
  Functions *gl;
  char *gs_code;
  char *fs_code;
  GeometryShaderLayeredFramebufferBlending *this_local;
  
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
  gs_code = 
  "${VERSION}\n\nprecision highp float;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(0.2);\n}\n"
  ;
  gl = (Functions *)anon_var_dwarf_71271f;
  fs_code = (char *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  _n_component = CONCAT44(extraout_var,iVar3);
  n_layer = 0;
  n_slice = 0;
  x = 0;
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
               ,0xb9);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  GVar4 = (**(code **)(_n_component + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(_n_component + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_gs_id = GVar4;
  GVar4 = (**(code **)(_n_component + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar5 = (**(code **)(_n_component + 0x800))();
  glu::checkError(dVar5,"Could not generate shader objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                  ,0xc1);
  GVar4 = (**(code **)(_n_component + 0x3c8))();
  this->m_po_id = GVar4;
  sh2_body_parts = &gl;
  bVar2 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&gs_code,this->m_gs_id,
                     1,(char **)sh2_body_parts,this->m_vs_id,1,&TestCaseBase::m_boilerplate_vs_code,
                     (bool *)0x0);
  uVar10 = (undefined4)((ulong)sh2_body_parts >> 0x20);
  if (bVar2) {
    for (n_layer = 0; n_layer < 0x10; n_layer = n_layer + 1) {
      ref_slice_pixels_ptr[3] = buffer_slice2 + (ulong)(n_layer << 2) + 0x38;
      for (y = 0; y < 4; y = y + 1) {
        *ref_slice_pixels_ptr[(ulong)y + 3] = '\0';
        ref_slice_pixels_ptr[(ulong)y + 3][1] = (uchar)(y * 0xff >> 2);
        ref_slice_pixels_ptr[(ulong)y + 3][2] = (uchar)(y * 0xff >> 3);
        ref_slice_pixels_ptr[(ulong)y + 3][3] = (uchar)((ulong)(y * 0xff) / 0xc);
      }
    }
    for (n_layer = 0; n_layer < 0x10; n_layer = n_layer + 1) {
      slice_pixels_ptr_1[3] = ref_buffer_slice2 + (ulong)(n_layer << 2) + 0x38;
      ref_slice_pixels_ptr[0] = ref_buffer_slice3 + (ulong)(n_layer << 2) + 0x38;
      ref_slice_pixels_ptr[1] = ref_buffer_slice4 + (ulong)(n_layer << 2) + 0x38;
      ref_slice_pixels_ptr[2] = local_288 + (n_layer << 2);
      slice_pixels_ptr_1[0] = buffer_slice3 + (ulong)(n_layer << 2) + 0x38;
      slice_pixels_ptr_1[1] = buffer_slice4 + (ulong)(n_layer << 2) + 0x38;
      slice_pixels_ptr_1[2] = ref_buffer_slice1 + (ulong)(n_layer << 2) + 0x38;
      for (y = 0; y < 4; y = y + 1) {
        puVar1 = slice_pixels_ptr_1[(ulong)y + 3];
        slice_rgba._8_8_ = slice_pixels_ptr_1[(ulong)y - 1];
        fStack_318 = (float)*(byte *)slice_rgba._8_8_ / 255.0;
        temp_component = (float)*(byte *)(slice_rgba._8_8_ + 1) / 255.0;
        slice_rgba[0] = (float)*(byte *)(slice_rgba._8_8_ + 2) / 255.0;
        slice_rgba[1] = (float)*(byte *)(slice_rgba._8_8_ + 3) / 255.0;
        for (n_slice = 0; n_slice < 4; n_slice = n_slice + 1) {
          ref_buffer._4_4_ =
               *(float *)((long)&stack0xfffffffffffffce8 + (ulong)n_slice * 4) *
               *(float *)((long)&stack0xfffffffffffffce8 + (ulong)n_slice * 4) + 0.16000001;
          if (0.0 <= ref_buffer._4_4_) {
            if (1.0 < ref_buffer._4_4_) {
              ref_buffer._4_4_ = 1.0;
            }
          }
          else {
            ref_buffer._4_4_ = 0.0;
          }
          puVar1[n_slice] = (uchar)(int)(ref_buffer._4_4_ * 255.0);
        }
      }
    }
    (**(code **)(_n_component + 0x6f8))(1,&this->m_to_id);
    (**(code **)(_n_component + 0xb8))(0x806f,this->m_to_id);
    (**(code **)(_n_component + 0x1398))(0x806f,1,0x8058,4,4);
    (**(code **)(_n_component + 0x13c0))
              (0x806f,0,0,0,0,4,CONCAT44(uVar9,4),CONCAT44(uVar10,1),0x1908,0x1401,
               buffer_slice2 + 0x38);
    (**(code **)(_n_component + 0x13c0))(0x806f,0,0,0,1,4,4,1,0x1908,0x1401,buffer_slice3 + 0x38);
    (**(code **)(_n_component + 0x13c0))(0x806f,0,0,0,2,4,4,1,0x1908,0x1401,buffer_slice4 + 0x38);
    (**(code **)(_n_component + 0x13c0))
              (0x806f,0,0,0,3,4,4,1,0x1908,0x1401,ref_buffer_slice1 + 0x38);
    dVar5 = (**(code **)(_n_component + 0x800))();
    glu::checkError(dVar5,"Could not set up texture object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0x117);
    (**(code **)(_n_component + 0x6d0))(1,&this->m_fbo_id);
    (**(code **)(_n_component + 0x78))(0x8ca9,this->m_fbo_id);
    (**(code **)(_n_component + 0x690))(0x8ca9,0x8ce0,this->m_to_id,0);
    dVar5 = (**(code **)(_n_component + 0x800))();
    glu::checkError(dVar5,"Could not set up draw framebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0x11f);
    (**(code **)(_n_component + 0x708))(1,&this->m_vao_id);
    (**(code **)(_n_component + 0xd8))(this->m_vao_id);
    dVar5 = (**(code **)(_n_component + 0x800))();
    glu::checkError(dVar5,"Could not set up vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0x125);
    (**(code **)(_n_component + 0x120))(0x301,0x306);
    (**(code **)(_n_component + 0x5e0))(0xbe2);
    (**(code **)(_n_component + 0x1680))(this->m_po_id);
    (**(code **)(_n_component + 0x1a00))(0,0,4);
    (**(code **)(_n_component + 0x538))(0,0,1);
    dVar5 = (**(code **)(_n_component + 0x800))();
    glu::checkError(dVar5,"Draw call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0x131);
    (**(code **)(_n_component + 0x6d0))(1,&this->m_read_fbo_id);
    (**(code **)(_n_component + 0x78))(0x8ca8);
    x = 0;
    while( true ) {
      if (3 < x) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      ref_buffer._3_1_ = 0;
      if (x == 0) {
        local_518 = ref_buffer_slice2 + 0x38;
      }
      else {
        if (x == 1) {
          local_520 = ref_buffer_slice3 + 0x38;
        }
        else {
          if (x == 2) {
            local_528 = ref_buffer_slice4 + 0x38;
          }
          else {
            local_528 = local_288;
          }
          local_520 = local_528;
        }
        local_518 = local_520;
      }
      puStack_328 = local_518;
      (**(code **)(_n_component + 0x6b8))(0x8ca8,0x8ce0,this->m_to_id,0,x);
      (**(code **)(_n_component + 0x1220))(0,0,4,4,0x1908,0x1401,buffer_slice1 + 0x38);
      dVar5 = (**(code **)(_n_component + 0x800))();
      glu::checkError(dVar5,"Could not read back pixel data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x143);
      buffer[0x38] = '\0';
      buffer[0x39] = '\0';
      buffer[0x3a] = '\0';
      buffer[0x3b] = '\0';
      for (; (uint)buffer._56_4_ < 4; buffer._56_4_ = buffer._56_4_ + 1) {
        ref_row._4_4_ = 4;
        row = puStack_328 + (uint)(buffer._56_4_ << 2);
        data = buffer_slice1 + (ulong)(uint)(buffer._56_4_ << 2) + 0x38;
        buffer[0x3c] = '\0';
        buffer[0x3d] = '\0';
        buffer[0x3e] = '\0';
        buffer[0x3f] = '\0';
        for (; (uint)buffer._60_4_ < 4; buffer._60_4_ = buffer._60_4_ + 1) {
          ref_data = data + (uint)(buffer._60_4_ << 2);
          local_350 = row + (uint)(buffer._60_4_ << 2);
          iVar3 = de::abs<int>((uint)*ref_data - (uint)*local_350);
          if ((((1 < iVar3) ||
               (iVar3 = de::abs<int>((uint)ref_data[1] - (uint)local_350[1]), 1 < iVar3)) ||
              (iVar3 = de::abs<int>((uint)ref_data[2] - (uint)local_350[2]), 1 < iVar3)) ||
             (iVar3 = de::abs<int>((uint)ref_data[3] - (uint)local_350[3]), 1 < iVar3)) {
            this_01 = tcu::TestContext::getLog
                                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)
            ;
            tcu::TestLog::operator<<(&local_4d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar8 = tcu::MessageBuilder::operator<<(&local_4d0,(char (*) [8])"(layer=");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&x);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])" x=");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)(buffer + 0x3c));
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])" y=");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)(buffer + 0x38));
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2b47c71);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [64])
                                       "Reference value is different than the rendered data (epsilon > "
                               );
            local_4d8[1] = 1;
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)(local_4d8 + 1));
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x2ba09a0);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2afcbef);
            local_4d8[0] = (uint)*local_350;
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_4d8);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
            local_4dc = (uint)local_350[1];
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4dc);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
            local_4e0 = (uint)local_350[2];
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4e0);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
            local_4e4 = (uint)local_350[3];
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4e4);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [6])") vs ");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2afcbef);
            local_4e8 = (uint)*ref_data;
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4e8);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
            local_4ec = (uint)ref_data[1];
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4ec);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
            local_4f0 = (uint)ref_data[2];
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4f0);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
            local_4f4 = (uint)ref_data[3];
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4f4);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2c156ab);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_4d0);
            ref_buffer._3_1_ = 1;
          }
        }
      }
      if ((ref_buffer._3_1_ & 1) != 0) break;
      x = x + 1;
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Pixel data comparison failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
               ,0x16a);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Could not build program object",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
             ,0xc9);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredFramebufferBlending::iterate(void)
{
/* Test-wide constants */
#define N_TEXTURE_COMPONENTS (4)
#define TEXTURE_DEPTH (4)
#define TEXTURE_HEIGHT (4)
#define TEXTURE_WIDTH (4)

	/* Fragment shader code */
	const char* fs_code = "${VERSION}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(0.2);\n"
						  "}\n";

	/* Geometry shader code */
	const char* gs_code = "${VERSION}\n"
						  "${GEOMETRY_SHADER_REQUIRE}\n"
						  "\n"
						  "layout(points)                          in;\n"
						  "layout(triangle_strip, max_vertices=64) out;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    for (int n = 0; n < 4; ++n)\n"
						  "    {\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(1, 1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(1, -1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(-1, 1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(-1, -1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        EndPrimitive();\n"
						  "    }\n"
						  "}\n";

	/* General variables */
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	unsigned int		  n			  = 0;
	unsigned int		  n_component = 0;
	unsigned int		  n_layer	 = 0;
	unsigned int		  n_slice	 = 0;
	unsigned int		  x			  = 0;
	unsigned int		  y			  = 0;

	unsigned char buffer[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice1[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice2[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice3[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice4[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice1[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice2[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice3[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice4[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];

	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Set up shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate shader objects");

	/* Set up program objects */
	m_po_id = gl.createProgram();

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fs_code, m_gs_id, 1 /* part */, &gs_code, m_vs_id, 1 /* part */,
					  &m_boilerplate_vs_code))
	{
		TCU_FAIL("Could not build program object");
	}

	/* Prepare texture data we will use for each slice */
	for (n = 0; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
	{
		unsigned char* slice_pixels_ptr[] = { buffer_slice1 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice2 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice3 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice4 + n * N_TEXTURE_COMPONENTS };

		for (n_slice = 0; n_slice < sizeof(slice_pixels_ptr) / sizeof(slice_pixels_ptr[0]); ++n_slice)
		{
			slice_pixels_ptr[n_slice][0] = 0;
			slice_pixels_ptr[n_slice][1] = (unsigned char)(n_slice * 255 / 4);
			slice_pixels_ptr[n_slice][2] = (unsigned char)(n_slice * 255 / 8);
			slice_pixels_ptr[n_slice][3] = (unsigned char)(n_slice * 255 / 12);
		} /* for (all slices) */
	}	 /* for (all pixels) */

	/* Calculate reference texture data we will later use when verifying the rendered data */
	for (n = 0; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
	{
		unsigned char* ref_slice_pixels_ptr[] = { ref_buffer_slice1 + n * N_TEXTURE_COMPONENTS,
												  ref_buffer_slice2 + n * N_TEXTURE_COMPONENTS,
												  ref_buffer_slice3 + n * N_TEXTURE_COMPONENTS,
												  ref_buffer_slice4 + n * N_TEXTURE_COMPONENTS };

		unsigned char* slice_pixels_ptr[] = { buffer_slice1 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice2 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice3 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice4 + n * N_TEXTURE_COMPONENTS };

		for (n_slice = 0; n_slice < sizeof(slice_pixels_ptr) / sizeof(slice_pixels_ptr[0]); ++n_slice)
		{
			unsigned char* ref_slice_ptr = ref_slice_pixels_ptr[n_slice];
			unsigned char* slice_ptr	 = slice_pixels_ptr[n_slice];
			float		   slice_rgba[]  = {
				float(slice_ptr[0]) / 255.0f, /* convert to FP representation */
				float(slice_ptr[1]) / 255.0f, /* convert to FP representation */
				float(slice_ptr[2]) / 255.0f, /* convert to FP representation */
				float(slice_ptr[3]) / 255.0f  /* convert to FP representation */
			};

			for (n_component = 0; n_component < N_TEXTURE_COMPONENTS; ++n_component)
			{
				float temp_component = slice_rgba[n_component] /* dst_color */ * slice_rgba[n_component] /* dst_color */
									   + 0.8f /* 1-src_color */ * 0.2f /* src_color */;

				/* Clamp if necessary */
				if (temp_component < 0)
				{
					temp_component = 0.0f;
				}
				else if (temp_component > 1)
				{
					temp_component = 1.0f;
				}

				/* Convert back to GL_RGBA8 */
				ref_slice_ptr[n_component] = (unsigned char)(temp_component * 255.0f);
			} /* for (all components) */
		}	 /* for (all slices) */
	}		  /* for (all pixels) */

	/* Set up texture object used for the test */
	gl.genTextures(1, &m_to_id);
	gl.bindTexture(GL_TEXTURE_3D, m_to_id);
	gl.texStorage3D(GL_TEXTURE_3D, 1 /* levels */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice1);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice2);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice3);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice4);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture object");

	/* Set up framebuffer object used for the test */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);

	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, 0 /* level */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up draw framebuffer");

	/* Generate and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up vertex array object");

	/* Set up blending */
	gl.blendFunc(GL_ONE_MINUS_SRC_COLOR, GL_DST_COLOR);
	gl.enable(GL_BLEND);

	/* Render */
	gl.useProgram(m_po_id);
	gl.viewport(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT);

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw call failed");

	/* Verify rendered data in the layers */
	gl.genFramebuffers(1, &m_read_fbo_id);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_read_fbo_id);

	for (n_layer = 0; n_layer < TEXTURE_DEPTH; ++n_layer)
	{
		bool has_layer_failed = false;

		const unsigned char* ref_buffer =
			(n_layer == 0) ?
				ref_buffer_slice1 :
				(n_layer == 1) ? ref_buffer_slice2 : (n_layer == 2) ? ref_buffer_slice3 : ref_buffer_slice4;

		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, 0 /* level */, n_layer);
		gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixel data!");

		for (y = 0; y < TEXTURE_HEIGHT; ++y)
		{
			const unsigned int   pixel_size = N_TEXTURE_COMPONENTS;
			const unsigned char* ref_row	= ref_buffer + y * pixel_size;
			const unsigned char* row		= buffer + y * pixel_size;

			for (x = 0; x < TEXTURE_WIDTH; ++x)
			{
#define EPSILON (1)

				const unsigned char* data	 = row + x * pixel_size;
				const unsigned char* ref_data = ref_row + x * pixel_size;

				if (de::abs((int)data[0] - (int)ref_data[0]) > EPSILON ||
					de::abs((int)data[1] - (int)ref_data[1]) > EPSILON ||
					de::abs((int)data[2] - (int)ref_data[2]) > EPSILON ||
					de::abs((int)data[3] - (int)ref_data[3]) > EPSILON)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "(layer=" << n_layer << " x=" << x << " y=" << y
									   << ") "
									   << "Reference value is different than the rendered data (epsilon > " << EPSILON
									   << "): "
									   << "(" << (unsigned int)ref_data[0] << ", " << (unsigned int)ref_data[1] << ", "
									   << (unsigned int)ref_data[2] << ", " << (unsigned int)ref_data[3] << ") vs "
									   << "(" << (unsigned int)data[0] << ", " << (unsigned int)data[1] << ", "
									   << (unsigned int)data[2] << ", " << (unsigned int)data[3] << ")."
									   << tcu::TestLog::EndMessage;

					has_layer_failed = true;
				} /* if (regions are different) */

#undef EPSILON
			} /* for (all pixels in a row) */
		}	 /* for (all rows) */

		if (has_layer_failed)
		{
			TCU_FAIL("Pixel data comparison failed");
		}
	} /* for (all layers) */

	/* Done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;

#undef N_TEXTURE_COMPONENTS
#undef TEXTURE_DEPTH
#undef TEXTURE_HEIGHT
#undef TEXTURE_WIDTH
}